

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O0

void __thiscall
Nova::Boundary_Uniform<float,_3>::Fill_Single_Ghost_Region
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,T_Arrays *u_ghost,int side,float dt,
          float time,Range<int,_3> *region)

{
  bool bVar1;
  int i;
  int *piVar2;
  T_INDEX *pTVar3;
  float *pfVar4;
  float fVar5;
  int local_1b4;
  undefined1 local_1a4 [8];
  T_Index boundary_index_3;
  T_Index index_4;
  T_Index boundary_index_2;
  T_Index index_3;
  T_Index boundary_index_1;
  T_Index index_2;
  T_Index boundary_index;
  T_Index index_1;
  T_Index index;
  Cell_Iterator iterator;
  int boundary;
  int axis;
  Range<int,_3> *region_local;
  float time_local;
  float dt_local;
  int side_local;
  T_Arrays *u_ghost_local;
  T_Grid *grid_local;
  Boundary_Uniform<float,_3> *this_local;
  
  i = side / 2;
  if (side % 2 == 0) {
    piVar2 = Vector<int,_3,_true>::operator[](&region->max_corner,i);
    local_1b4 = *piVar2 + 1;
  }
  else {
    piVar2 = Vector<int,_3,_true>::operator[](&region->min_corner,i);
    local_1b4 = *piVar2 + -1;
  }
  Grid_Iterator_Cell<float,_3>::Grid_Iterator_Cell
            ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1),grid,region);
  if (((this->super_Boundary<float,_3>).use_fixed_boundary & 1U) == 0) {
    if ((((this->super_Boundary<float,_3>).clamp_below & 1U) == 0) ||
       (((this->super_Boundary<float,_3>).clamp_above & 1U) == 0)) {
      if (((this->super_Boundary<float,_3>).clamp_below & 1U) == 0) {
        if (((this->super_Boundary<float,_3>).clamp_above & 1U) == 0) {
          while (bVar1 = Grid_Iterator<float,_3>::Valid
                                   ((Grid_Iterator<float,_3> *)(index._data._M_elems + 1)), bVar1) {
            pTVar3 = Grid_Iterator_Cell<float,_3>::Cell_Index
                               ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1));
            Vector<int,_3,_true>::Vector
                      ((Vector<int,_3,_true> *)(boundary_index_3._data._M_elems + 1),pTVar3);
            Vector<int,_3,_true>::Vector
                      ((Vector<int,_3,_true> *)local_1a4,
                       (Vector<int,_3,_true> *)(boundary_index_3._data._M_elems + 1));
            piVar2 = Vector<int,_3,_true>::operator[]((Vector<int,_3,_true> *)local_1a4,i);
            *piVar2 = local_1b4;
            pfVar4 = Array_ND<float,_3>::operator()(u_ghost,(Vector<int,_3,_true> *)local_1a4);
            fVar5 = *pfVar4;
            pfVar4 = Array_ND<float,_3>::operator()
                               (u_ghost,(Vector<int,_3,_true> *)
                                        (boundary_index_3._data._M_elems + 1));
            *pfVar4 = fVar5;
            Grid_Iterator<float,_3>::Next((Grid_Iterator<float,_3> *)(index._data._M_elems + 1));
          }
        }
        else {
          while (bVar1 = Grid_Iterator<float,_3>::Valid
                                   ((Grid_Iterator<float,_3> *)(index._data._M_elems + 1)), bVar1) {
            pTVar3 = Grid_Iterator_Cell<float,_3>::Cell_Index
                               ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1));
            Vector<int,_3,_true>::Vector
                      ((Vector<int,_3,_true> *)(boundary_index_2._data._M_elems + 1),pTVar3);
            Vector<int,_3,_true>::Vector
                      ((Vector<int,_3,_true> *)(index_4._data._M_elems + 1),
                       (Vector<int,_3,_true> *)(boundary_index_2._data._M_elems + 1));
            piVar2 = Vector<int,_3,_true>::operator[]
                               ((Vector<int,_3,_true> *)(index_4._data._M_elems + 1),i);
            *piVar2 = local_1b4;
            pfVar4 = Array_ND<float,_3>::operator()
                               (u_ghost,(Vector<int,_3,_true> *)(index_4._data._M_elems + 1));
            pfVar4 = std::min<float>(pfVar4,&(this->super_Boundary<float,_3>).upper_threshold);
            fVar5 = *pfVar4;
            pfVar4 = Array_ND<float,_3>::operator()
                               (u_ghost,(Vector<int,_3,_true> *)
                                        (boundary_index_2._data._M_elems + 1));
            *pfVar4 = fVar5;
            Grid_Iterator<float,_3>::Next((Grid_Iterator<float,_3> *)(index._data._M_elems + 1));
          }
        }
      }
      else {
        while (bVar1 = Grid_Iterator<float,_3>::Valid
                                 ((Grid_Iterator<float,_3> *)(index._data._M_elems + 1)), bVar1) {
          pTVar3 = Grid_Iterator_Cell<float,_3>::Cell_Index
                             ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1));
          Vector<int,_3,_true>::Vector
                    ((Vector<int,_3,_true> *)(boundary_index_1._data._M_elems + 1),pTVar3);
          Vector<int,_3,_true>::Vector
                    ((Vector<int,_3,_true> *)(index_3._data._M_elems + 1),
                     (Vector<int,_3,_true> *)(boundary_index_1._data._M_elems + 1));
          piVar2 = Vector<int,_3,_true>::operator[]
                             ((Vector<int,_3,_true> *)(index_3._data._M_elems + 1),i);
          *piVar2 = local_1b4;
          pfVar4 = Array_ND<float,_3>::operator()
                             (u_ghost,(Vector<int,_3,_true> *)(index_3._data._M_elems + 1));
          pfVar4 = std::max<float>(pfVar4,&(this->super_Boundary<float,_3>).lower_threshold);
          fVar5 = *pfVar4;
          pfVar4 = Array_ND<float,_3>::operator()
                             (u_ghost,(Vector<int,_3,_true> *)(boundary_index_1._data._M_elems + 1))
          ;
          *pfVar4 = fVar5;
          Grid_Iterator<float,_3>::Next((Grid_Iterator<float,_3> *)(index._data._M_elems + 1));
        }
      }
    }
    else {
      while (bVar1 = Grid_Iterator<float,_3>::Valid
                               ((Grid_Iterator<float,_3> *)(index._data._M_elems + 1)), bVar1) {
        pTVar3 = Grid_Iterator_Cell<float,_3>::Cell_Index
                           ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1));
        Vector<int,_3,_true>::Vector
                  ((Vector<int,_3,_true> *)(boundary_index._data._M_elems + 1),pTVar3);
        Vector<int,_3,_true>::Vector
                  ((Vector<int,_3,_true> *)(index_2._data._M_elems + 1),
                   (Vector<int,_3,_true> *)(boundary_index._data._M_elems + 1));
        piVar2 = Vector<int,_3,_true>::operator[]
                           ((Vector<int,_3,_true> *)(index_2._data._M_elems + 1),i);
        *piVar2 = local_1b4;
        pfVar4 = Array_ND<float,_3>::operator()
                           (u_ghost,(Vector<int,_3,_true> *)(index_2._data._M_elems + 1));
        fVar5 = Nova_Utilities::Clamp<float>
                          (*pfVar4,(this->super_Boundary<float,_3>).lower_threshold,
                           (this->super_Boundary<float,_3>).upper_threshold);
        pfVar4 = Array_ND<float,_3>::operator()
                           (u_ghost,(Vector<int,_3,_true> *)(boundary_index._data._M_elems + 1));
        *pfVar4 = fVar5;
        Grid_Iterator<float,_3>::Next((Grid_Iterator<float,_3> *)(index._data._M_elems + 1));
      }
    }
  }
  else {
    while (bVar1 = Grid_Iterator<float,_3>::Valid
                             ((Grid_Iterator<float,_3> *)(index._data._M_elems + 1)), bVar1) {
      pTVar3 = Grid_Iterator_Cell<float,_3>::Cell_Index
                         ((Grid_Iterator_Cell<float,_3> *)(index._data._M_elems + 1));
      Vector<int,_3,_true>::Vector((Vector<int,_3,_true> *)(index_1._data._M_elems + 1),pTVar3);
      fVar5 = (this->super_Boundary<float,_3>).fixed_boundary_value;
      pfVar4 = Array_ND<float,_3>::operator()
                         (u_ghost,(Vector<int,_3,_true> *)(index_1._data._M_elems + 1));
      *pfVar4 = fVar5;
      Grid_Iterator<float,_3>::Next((Grid_Iterator<float,_3> *)(index._data._M_elems + 1));
    }
  }
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Single_Ghost_Region(const T_Grid& grid,T_Arrays& u_ghost,const int side,const T dt,const T time,const Range<int,d>& region) const
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    int axis=side/2,boundary=(side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;
    Cell_Iterator iterator(grid,region);
    if(use_fixed_boundary) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index();
        u_ghost(index)=fixed_boundary_value;}
    else if(clamp_below&&clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=Nova_Utilities::Clamp<T>(u_ghost(boundary_index),lower_threshold,upper_threshold);}
    else if(clamp_below) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::max(u_ghost(boundary_index),lower_threshold);}
    else if(clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::min(u_ghost(boundary_index),upper_threshold);}
    else for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=u_ghost(boundary_index);}
}